

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

int __thiscall ON_BinaryArchive::GetCurrentChunk(ON_BinaryArchive *this,ON_3DM_CHUNK *chunk)

{
  ON__UINT8 OVar1;
  ON__UINT8 OVar2;
  ON__UINT8 OVar3;
  ON__UINT16 OVar4;
  int iVar5;
  uint uVar6;
  ON__UINT32 OVar7;
  ON_3DM_BIG_CHUNK *pOVar8;
  char *sFormat;
  int line_number;
  long lVar9;
  ulong uVar10;
  
  chunk->m_do_length = 0;
  chunk->m_do_crc16 = 0;
  chunk->m_crc16 = 0;
  chunk->m_do_crc32 = 0;
  chunk->m_crc32 = 0;
  chunk->m_offset = 0;
  chunk->m_typecode = 0;
  chunk->m_value = 0;
  iVar5 = (this->m_chunk).m_count;
  lVar9 = (long)iVar5;
  if (lVar9 < 1) {
    return iVar5;
  }
  pOVar8 = (this->m_chunk).m_a;
  uVar10 = pOVar8[lVar9 + -1].m_big_value;
  uVar6 = pOVar8[lVar9 + -1].m_typecode;
  OVar1 = pOVar8[lVar9 + -1].m_bLongChunk;
  OVar2 = pOVar8[lVar9 + -1].m_do_crc16;
  OVar3 = pOVar8[lVar9 + -1].m_do_crc32;
  OVar4 = pOVar8[lVar9 + -1].m_crc16;
  OVar7 = pOVar8[lVar9 + -1].m_crc32;
  chunk->m_offset = pOVar8[lVar9 + -1].m_start_offset;
  chunk->m_typecode = uVar6;
  if ((int)uVar6 < 0) {
    if ((long)(int)uVar10 == uVar10) goto LAB_003a0794;
    sFormat = "i64 too big to convert to 4 byte signed int";
    line_number = 0xee;
  }
  else {
    if (uVar10 >> 0x20 == 0) goto LAB_003a0794;
    sFormat = "u64 too big to convert to 4 byte unsigned int";
    line_number = 0xfc;
  }
  uVar10 = 0;
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,line_number,"",sFormat);
LAB_003a0794:
  chunk->m_value = (int)uVar10;
  chunk->m_do_length = (uint)(OVar1 != '\0');
  chunk->m_do_crc16 = (ushort)(OVar2 != '\0');
  chunk->m_do_crc32 = (uint)(OVar3 != '\0');
  chunk->m_crc16 = OVar4;
  chunk->m_crc32 = OVar7;
  return iVar5;
}

Assistant:

int ON_BinaryArchive::GetCurrentChunk(ON_3DM_CHUNK& chunk) const
{
  ON_3DM_BIG_CHUNK big_chunk;
  memset(&chunk,0,sizeof(ON_3DM_CHUNK));
  memset(&big_chunk,0,sizeof(big_chunk));
  int rc = GetCurrentChunk(big_chunk);
  if ( rc > 0 )
  {
    chunk.m_offset = (size_t)big_chunk.m_start_offset;
    chunk.m_typecode = big_chunk.m_typecode;

    ON__INT32 i32 = 0;
    if ( ON_IsLongChunkTypecode( big_chunk.m_typecode ) )
      DownSizeUINT( (ON__UINT64)big_chunk.m_big_value, (ON__UINT32*)&i32 );
    else
      DownSizeINT( big_chunk.m_big_value, &i32 );
    chunk.m_value = i32;

    chunk.m_do_length = big_chunk.m_bLongChunk ? 1 : 0;
    chunk.m_do_crc16 = big_chunk.m_do_crc16 ? 1 : 0;
    chunk.m_do_crc32 = big_chunk.m_do_crc32 ? 1 : 0;
    chunk.m_crc16 = big_chunk.m_crc16;
    chunk.m_crc32 = big_chunk.m_crc32;
  }
  return rc;
}